

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvs.c
# Opt level: O2

void simulate_unbind(FX2 *frame,int unbind_count,FX2 *returner)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  DLword *pDVar4;
  
  lVar1 = (ulong)((uint)frame->nextblock * 2) + (long)Stackspace;
  iVar2 = 0;
  if (unbind_count < 1) {
    unbind_count = 0;
  }
  for (; iVar2 != unbind_count; iVar2 = iVar2 + 1) {
    do {
      uVar3 = *(uint *)(lVar1 + -4);
      lVar1 = lVar1 + -4;
    } while (-1 < (int)uVar3);
    pDVar4 = &frame[1].alink + (uVar3 & 0xffff);
    for (uVar3 = ~uVar3 >> 0x10; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      *(undefined4 *)pDVar4 = 0xffffffff;
      pDVar4 = pDVar4 + -2;
    }
  }
  if (returner != (FX2 *)0x0) {
    returner->field_0x3 = returner->field_0x3 & 0xef;
  }
  return;
}

Assistant:

void simulate_unbind(FX2 *frame, int unbind_count, FX2 *returner) {
  int unbind;
  LispPTR *stackptr = (LispPTR *)(Stackspace + frame->nextblock);
  for (unbind = 0; unbind < unbind_count; unbind++) {
    int value;
    LispPTR *lastpvar;
    int bindnvalues;
    for (; ((int)*--stackptr >= 0);)
      ; /* find the binding mark */
    value = (int)*stackptr;
    lastpvar = (LispPTR *)((DLword *)frame + FRAMESIZE + 2 + GetLoWord(value));
    bindnvalues = (~value) >> 16;
    for (value = bindnvalues; --value >= 0;) { *--lastpvar = 0xffffffff; }
    /* This line caused \NSMAIL.READ.HEADING to smash memory, */
    /* so I removed it 21 Jul 91 --JDS.  This was the only	  */
    /* difference between this function and the UNWIND code   */
    /* in inlineC.h						  */
    /*	MAKEFREEBLOCK(stackptr, (DLword *)stackptr-nextblock); */
  }
  if (returner)
    returner->fast = 0; /* since we've destroyed contiguity */
                        /* in the stack, but that only
                           matters if there's a return. */
}